

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# maplayers.cpp
# Opt level: O2

void PlaceEggDoodads(int LayerWidth,int LayerHeight,CTile *aOutTiles,CTile *aGameLayerTiles,
                    int ItemWidth,int ItemHeight,int *aImageTileID,int ImageTileIDCount,int Freq)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  byte bVar4;
  byte bVar5;
  uchar uVar6;
  int iVar7;
  int iVar8;
  ulong uVar9;
  ulong uVar10;
  ulong uVar11;
  CTile *pCVar12;
  CTile *pCVar13;
  ulong uVar14;
  byte bVar15;
  uchar uVar16;
  CTile *pCVar17;
  CTile *pCVar18;
  CTile *pCVar19;
  CTile *pCVar20;
  int iVar21;
  int ix;
  ulong uVar22;
  int iVar23;
  CTile *local_80;
  CTile *local_78;
  CTile *local_70;
  
  uVar14 = (ulong)(uint)ItemHeight;
  uVar1 = ItemWidth;
  if (ItemWidth < 1) {
    uVar1 = 0;
  }
  if (ItemHeight < 1) {
    uVar14 = 0;
  }
  uVar2 = LayerWidth - ItemWidth;
  if (LayerWidth - ItemWidth < 1) {
    uVar2 = 0;
  }
  iVar8 = 0;
  uVar3 = LayerHeight - ItemHeight;
  if (LayerHeight - ItemHeight < 1) {
    uVar3 = 0;
  }
  local_78 = aGameLayerTiles + LayerWidth;
  uVar11 = 0;
  local_80 = aOutTiles;
  local_70 = aGameLayerTiles;
  do {
    if (uVar11 == uVar3) {
      return;
    }
    pCVar12 = local_70;
    pCVar17 = local_80;
    pCVar19 = local_78;
    iVar23 = iVar8;
    for (uVar9 = 0; uVar9 != uVar2; uVar9 = uVar9 + 1) {
      bVar5 = 1;
      bVar4 = 0;
      bVar15 = 0;
      pCVar13 = pCVar12;
      pCVar18 = pCVar17;
      pCVar20 = pCVar19;
      for (uVar10 = 0; uVar10 != uVar14; uVar10 = uVar10 + 1) {
        for (uVar22 = 0; uVar1 != uVar22; uVar22 = uVar22 + 1) {
          if (pCVar18[uVar22].m_Index != '\0') {
            bVar15 = 1;
            break;
          }
          if (pCVar13[uVar22].m_Index == '\x01') {
            bVar4 = 1;
            break;
          }
          if ((uVar10 == ItemHeight - 1) && (pCVar20[uVar22].m_Index != '\x01')) {
            bVar5 = 0;
            break;
          }
        }
        pCVar20 = pCVar20 + LayerWidth;
        pCVar18 = pCVar18 + LayerWidth;
        pCVar13 = pCVar13 + LayerWidth;
      }
      if ((!(bool)(~bVar5 & 1) && !(bool)(bVar15 | bVar4)) &&
         (iVar7 = random_int(), iVar7 % Freq == 0)) {
        iVar7 = random_int();
        uVar6 = (uchar)aImageTileID[iVar7 % ImageTileIDCount];
        iVar7 = iVar23;
        for (uVar10 = 0; uVar22 = (ulong)uVar1, uVar16 = uVar6, iVar21 = iVar7, uVar10 != uVar14;
            uVar10 = uVar10 + 1) {
          while (uVar22 != 0) {
            aOutTiles[iVar21].m_Index = uVar16;
            uVar22 = uVar22 - 1;
            uVar16 = uVar16 + '\x01';
            iVar21 = iVar21 + 1;
          }
          iVar7 = iVar7 + LayerWidth;
          uVar6 = uVar6 + '\x10';
        }
      }
      pCVar19 = pCVar19 + 1;
      pCVar17 = pCVar17 + 1;
      pCVar12 = pCVar12 + 1;
      iVar23 = iVar23 + 1;
    }
    uVar11 = uVar11 + 1;
    local_78 = local_78 + LayerWidth;
    local_80 = local_80 + LayerWidth;
    local_70 = local_70 + LayerWidth;
    iVar8 = iVar8 + LayerWidth;
  } while( true );
}

Assistant:

static void PlaceEggDoodads(int LayerWidth, int LayerHeight, CTile* aOutTiles, CTile* aGameLayerTiles, int ItemWidth, int ItemHeight, const int* aImageTileID, int ImageTileIDCount, int Freq)
{
	for(int y = 0; y < LayerHeight-ItemHeight; y++)
	{
		for(int x = 0; x < LayerWidth-ItemWidth; x++)
		{
			bool Overlap = false;
			bool ObstructedByWall = false;
			bool HasGround = true;

			for(int iy = 0; iy < ItemHeight; iy++)
			{
				for(int ix = 0; ix < ItemWidth; ix++)
				{
					int Tid = (y+iy) * LayerWidth + (x+ix);
					int DownTid = (y+iy+1) * LayerWidth + (x+ix);

					if(aOutTiles[Tid].m_Index != 0)
					{
						Overlap = true;
						break;
					}

					if(aGameLayerTiles[Tid].m_Index == 1)
					{
						ObstructedByWall = true;
						break;
					}

					if(iy == ItemHeight-1 && aGameLayerTiles[DownTid].m_Index != 1)
					{
						HasGround = false;
						break;
					}
				}
			}

			if(!Overlap && !ObstructedByWall && HasGround && random_int()%Freq == 0)
			{
				const int BaskerStartID = aImageTileID[random_int()%ImageTileIDCount];

				for(int iy = 0; iy < ItemHeight; iy++)
				{
					for(int ix = 0; ix < ItemWidth; ix++)
					{
						int Tid = (y+iy) * LayerWidth + (x+ix);
						aOutTiles[Tid].m_Index = BaskerStartID + iy * 16 + ix;
					}
				}
			}
		}
	}
}